

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_base_operation<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
               (void)

{
  uint uVar1;
  pointer puVar2;
  Column_settings *pCVar3;
  Column_settings *pCVar4;
  Column_zp_settings *this;
  undefined4 uVar5;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_> m;
  anon_class_1_0_00000001 local_1b3;
  anon_class_1_0_00000001 local_1b2;
  anon_class_1_0_00000001 local_1b1;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_1b0;
  anon_class_8_1_e4bd5e45 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  anon_class_8_1_e4bd5e45 local_170;
  Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>
  local_168;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>::
  Column_zp_settings::Column_zp_settings(this,5);
  local_168.colSettings_ = this;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
  ::
  Boundary_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
              *)&local_168.matrix_,&local_1b0,this);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
            (&local_1b0,&local_168);
  local_198.targetColumn =
       local_168.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 7;
  local_170.targetColumn = local_198.targetColumn;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Bound___lse,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>::Matrix_column_tag,1u>_false>___1_>
            (local_168.matrix_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 6,local_198.targetColumn,&local_1b1,
             &local_198,&local_170,&local_1b2,&local_1b3);
  local_198.targetColumn._0_4_ = 0;
  local_198.targetColumn._4_4_ = 1;
  uStack_190 = 0x100000003;
  local_188 = 0x400000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_1b0.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 7),&local_198);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
            (&local_1b0,&local_168);
  uVar1 = ((local_168.colSettings_)->operators).characteristic_;
  local_198.targetColumn._0_4_ = 3;
  if ((int)uVar1 < 4) {
    local_198.targetColumn._0_4_ = (undefined4)(3 % (ulong)uVar1);
  }
  Gudhi::persistence_matrix::
  _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>>
            ((Field_element *)&local_198,
             local_168.matrix_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3,
             local_168.matrix_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5);
  local_198.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>
        *)0x100000000;
  uStack_190 = 0x200000001;
  local_188 = 0x200000002;
  uStack_180 = 4;
  uStack_17c = 1;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_1b0.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5),&local_198);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
            (&local_1b0,&local_168);
  uVar1 = ((local_168.colSettings_)->operators).characteristic_;
  uVar5 = 3;
  if ((int)uVar1 < 4) {
    uVar5 = (undefined4)(3 % (ulong)uVar1);
  }
  local_198.targetColumn._0_4_ = uVar5;
  Gudhi::persistence_matrix::
  _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>>
            ((Field_element *)&local_198,
             local_168.matrix_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3,
             local_168.matrix_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 6);
  local_198.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>
        *)0x400000000;
  uStack_190 = 0x200000001;
  local_188 = 0x200000004;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_1b0.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 6),&local_198);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
            (&local_1b0,&local_168);
  pCVar3 = local_168.colSettings_;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
  ::_M_erase_at_end(&local_168.matrix_.matrix_,
                    local_168.matrix_.matrix_.
                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pCVar4 = local_168.colSettings_;
  local_168.matrix_.nextInsertIndex_ = 0;
  local_168.matrix_.colSettings_ = pCVar3;
  if (local_168.colSettings_ != (Column_zp_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)
               &(local_168.colSettings_)->entryConstructor);
    puVar2 = (pCVar4->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)(pCVar4->operators).inverse_.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2)
      ;
    }
  }
  operator_delete(pCVar4,0x58);
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>
  ::~Boundary_matrix(&local_168.matrix_);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_1b0);
  return;
}

Assistant:

void test_base_operation() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.add_to(6, 7);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[7] = {0, 3, 5};
  } else {
    columns[7] = {{0, 1}, {3, 1}, {5, 4}};
  }
  test_content_equality(columns, m);

  if constexpr (!Matrix::isNonBasic) {
    m.add_to(m.get_column(3), 10);
    if constexpr (Matrix::Option_list::is_z2) {
      columns[10] = {1};
    } else {
      columns[10] = {{0, 2}, {1, 4}};
    }
    test_content_equality(columns, m);
  }

  m.multiply_target_and_add_to(3, 3, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {0, 2, 4};
  } else {
    columns[5] = {{0, 1}, {1, 2}, {2, 2}, {4, 1}};
  }
  test_content_equality(columns, m);

  m.multiply_source_and_add_to(3, 3, 6);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[6] = {1};
  } else {
    columns[6] = {{0, 4}, {1, 2}, {4, 2}};
  }
  test_content_equality(columns, m);
}